

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

Fl_Tree_Item * __thiscall
Fl_Tree_Item::insert_above(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,char *new_label)

{
  Fl_Tree_Item *pFVar1;
  long lVar2;
  
  pFVar1 = this->_parent;
  if ((pFVar1 != (Fl_Tree_Item *)0x0) && (0 < (pFVar1->_children)._total)) {
    lVar2 = 0;
    do {
      if ((pFVar1->_children)._items[lVar2] == this) {
        pFVar1 = insert(pFVar1,prefs,new_label,(int)lVar2);
        return pFVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (pFVar1->_children)._total);
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::insert_above(const Fl_Tree_Prefs &prefs, const char *new_label) {
  Fl_Tree_Item *p = _parent;
  if ( ! p ) return(0);
  // Walk our parent's children to find ourself
  for ( int t=0; t<p->children(); t++ ) {
    Fl_Tree_Item *c = p->child(t);
    if ( this == c ) {
      return(p->insert(prefs, new_label, t));
    }
  }
  return(0);
}